

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::SetUnderwaterAcousticEmitterSystem
          (Underwater_Acoustic_PDU *this,
          vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
          *UAES)

{
  bool bVar1;
  byte bVar2;
  pointer pUVar3;
  size_type sVar4;
  __normal_iterator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
  local_50;
  __normal_iterator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
  local_48;
  UnderwaterAcousticEmitterSystem *local_40;
  __normal_iterator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
  local_38;
  __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
  local_30;
  const_iterator citrEnd;
  __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
  local_20;
  const_iterator citr;
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
  *UAES_local;
  Underwater_Acoustic_PDU *this_local;
  
  citr._M_current = (UnderwaterAcousticEmitterSystem *)UAES;
  citrEnd._M_current =
       (UnderwaterAcousticEmitterSystem *)
       std::
       vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
       ::begin(&this->m_vUAES);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_const*,std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>>>
  ::__normal_iterator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem*>
            ((__normal_iterator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_const*,std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>>>
              *)&local_20,
             (__normal_iterator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
              *)&citrEnd);
  local_38._M_current =
       (UnderwaterAcousticEmitterSystem *)
       std::
       vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
       ::end(&this->m_vUAES);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_const*,std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>>>
  ::__normal_iterator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem*>
            ((__normal_iterator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_const*,std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>>>
              *)&local_30,&local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    pUVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
             ::operator->(&local_20);
    bVar2 = DATA_TYPE::UnderwaterAcousticEmitterSystem::GetEmitterSystemDataLength(pUVar3);
    (this->super_Header).super_Header6.m_ui16PDULength =
         (this->super_Header).super_Header6.m_ui16PDULength + (ushort)bVar2 * -4;
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
    ::operator++(&local_20);
  }
  std::
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
  ::operator=(&this->m_vUAES,
              (vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
               *)citr._M_current);
  local_48._M_current =
       (UnderwaterAcousticEmitterSystem *)
       std::
       vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
       ::begin(&this->m_vUAES);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_const*,std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>>>
  ::__normal_iterator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem*>
            ((__normal_iterator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_const*,std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>>>
              *)&local_40,&local_48);
  local_20._M_current = local_40;
  while( true ) {
    local_50._M_current =
         (UnderwaterAcousticEmitterSystem *)
         std::
         vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
         ::end(&this->m_vUAES);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_50);
    if (!bVar1) break;
    pUVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
             ::operator->(&local_20);
    bVar2 = DATA_TYPE::UnderwaterAcousticEmitterSystem::GetEmitterSystemDataLength(pUVar3);
    (this->super_Header).super_Header6.m_ui16PDULength =
         (this->super_Header).super_Header6.m_ui16PDULength + (ushort)bVar2 * 4;
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem_*,_std::vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>_>
    ::operator++(&local_20);
  }
  sVar4 = std::
          vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
          ::size(&this->m_vUAES);
  this->m_ui8NumEmitterSys = (KUINT8)sVar4;
  return;
}

Assistant:

void Underwater_Acoustic_PDU::SetUnderwaterAcousticEmitterSystem( const vector<UnderwaterAcousticEmitterSystem> & UAES )
{
    // Reset PDU length
    vector<UnderwaterAcousticEmitterSystem>::const_iterator citr = m_vUAES.begin();
    vector<UnderwaterAcousticEmitterSystem>::const_iterator citrEnd = m_vUAES.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength -= citr->GetEmitterSystemDataLength() * 4;
    }

    m_vUAES = UAES;

    citr = m_vUAES.begin();

    for( ; citr != m_vUAES.end(); ++citr )
    {
        m_ui16PDULength += citr->GetEmitterSystemDataLength() * 4;
    }

    m_ui8NumEmitterSys = m_vUAES.size();
}